

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utilities.cpp
# Opt level: O2

void __thiscall ThreadedImageSaver::~ThreadedImageSaver(ThreadedImageSaver *this)

{
  pointer ptVar1;
  vector<std::thread,_std::allocator<std::thread>_> *__range1;
  thread *thread;
  pointer ptVar2;
  
  this->stopped = true;
  std::mutex::lock(&this->mtx);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
  std::condition_variable::notify_all();
  ptVar1 = (this->threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (ptVar2 = (this->threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                _M_impl.super__Vector_impl_data._M_start; ptVar2 != ptVar1; ptVar2 = ptVar2 + 1) {
    std::thread::join();
  }
  std::condition_variable::~condition_variable(&this->cv);
  std::
  vector<std::pair<Image,_std::filesystem::__cxx11::path>,_std::allocator<std::pair<Image,_std::filesystem::__cxx11::path>_>_>
  ::~vector(&this->images);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&this->threads);
  return;
}

Assistant:

ThreadedImageSaver::~ThreadedImageSaver() {
	stopped = true;
	(void)std::lock_guard<std::mutex>(mtx);
	cv.notify_all();
	for (auto& thread : threads) {
		thread.join();
	}
}